

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<32u,unsigned_int,void,true>::wr_string<char*>
          (uintwide_t<32u,unsigned_int,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  byte abStack_39 [25];
  
  iVar6 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar6 == 0x10) {
    abStack_39[1] = 0;
    abStack_39[2] = 0;
    abStack_39[3] = 0;
    abStack_39[4] = 0;
    abStack_39[5] = 0;
    abStack_39[6] = 0;
    abStack_39[7] = 0;
    abStack_39[8] = 0;
    abStack_39[9] = 0;
    abStack_39[10] = 0;
    abStack_39[0xb] = 0;
    abStack_39[0xc] = 0;
    abStack_39[0xd] = 0;
    abStack_39[0xe] = 0;
    abStack_39[0xf] = 0;
    if (*(uint *)this == 0) {
      abStack_39[0xf] = 0x30;
      uVar8 = 0xe;
    }
    else {
      uVar8 = 0xf;
      uVar10 = *(uint *)this;
      do {
        cVar2 = (char)(uVar10 & 0xf);
        bVar9 = cVar2 + 0x30;
        if (9 < (uVar10 & 0xf)) {
          bVar9 = cVar2 + !is_uppercase * ' ' + '7';
        }
        abStack_39[uVar8] = bVar9;
        uVar8 = uVar8 - 1;
        bVar1 = 0xf < uVar10;
        uVar10 = uVar10 >> 4;
      } while (bVar1);
    }
    if (show_base && 1 < (long)uVar8) {
      abStack_39[(ulong)((int)uVar8 - 1) + 1] = !is_uppercase << 5 | 0x58;
      uVar8 = uVar8 - 2;
      abStack_39[(uVar8 & 0xffffffff) + 1] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar8)) {
      uVar8 = uVar8 - 1;
      abStack_39[(uVar8 & 0xffffffff) + 1] = 0x2b;
    }
    if (field_width != 0) {
      uVar4 = 0xf;
      if (field_width < 0xf) {
        uVar4 = field_width;
      }
      uVar7 = uVar8;
      while ((long)(uVar4 ^ 0xf) < (long)uVar7) {
        uVar7 = uVar7 - 1;
        abStack_39[(uVar7 & 0xffffffff) + 1] = fill_char_str;
        uVar8 = uVar4 ^ 0xf;
      }
    }
    abStack_39[0x10] = 0;
    lVar5 = 0;
    do {
      bVar9 = abStack_39[lVar5 + uVar8 + 1];
      str_result[lVar5] = bVar9;
      lVar5 = lVar5 + 1;
    } while (bVar9 != 0);
  }
  else if (iVar6 == 10) {
    uVar10 = *(uint *)this;
    abStack_39[1] = 0;
    abStack_39[2] = 0;
    abStack_39[3] = 0;
    abStack_39[4] = 0;
    abStack_39[5] = 0;
    abStack_39[6] = 0;
    abStack_39[7] = 0;
    abStack_39[8] = 0;
    abStack_39[9] = 0;
    abStack_39[10] = 0;
    abStack_39[0xb] = 0;
    abStack_39[0xc] = 0;
    abStack_39[0xd] = 0;
    abStack_39[0xe] = 0;
    abStack_39[0xf] = 0;
    abStack_39[0x10] = 0;
    abStack_39[0x11] = 0;
    abStack_39[0x12] = 0;
    if (uVar10 == 0) {
      abStack_39[0x12] = 0x30;
      uVar8 = 0x11;
    }
    else {
      uVar3 = -uVar10;
      if (0 < (int)uVar10) {
        uVar3 = uVar10;
      }
      uVar4 = 0x12;
      do {
        abStack_39[uVar4] = (char)(uVar3 / 10) * -10 + (char)uVar3 + 0x30;
        uVar8 = uVar4 - 1;
        if (uVar4 < 2) break;
        bVar1 = 9 < uVar3;
        uVar4 = uVar8;
        uVar3 = uVar3 / 10;
      } while (bVar1);
    }
    if ((0 < (long)uVar8) && ((int)uVar10 < 0 || show_pos)) {
      bVar9 = 0x2d;
      if (-1 < (int)uVar10) {
        bVar9 = !show_pos * '\x02' + 0x2b;
      }
      uVar8 = uVar8 - 1;
      abStack_39[(uVar8 & 0xffffffff) + 1] = bVar9;
    }
    if (field_width != 0) {
      lVar5 = 0;
      if (field_width < 0x13) {
        lVar5 = 0x12 - field_width;
      }
      while (lVar5 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        abStack_39[(uVar8 & 0xffffffff) + 1] = fill_char_str;
      }
    }
    abStack_39[0x13] = 0;
    lVar5 = 0;
    do {
      bVar9 = abStack_39[lVar5 + uVar8 + 1];
      str_result[lVar5] = bVar9;
      lVar5 = lVar5 + 1;
    } while (bVar9 != 0);
  }
  else {
    if (iVar6 != 8) {
      return false;
    }
    uVar10 = *(uint *)this;
    abStack_39[1] = 0;
    abStack_39[2] = 0;
    abStack_39[3] = 0;
    abStack_39[4] = 0;
    abStack_39[5] = 0;
    abStack_39[6] = 0;
    abStack_39[7] = 0;
    abStack_39[8] = 0;
    abStack_39[9] = 0;
    abStack_39[10] = 0;
    abStack_39[0xb] = 0;
    abStack_39[0xc] = 0;
    abStack_39[0xd] = 0;
    abStack_39[0xe] = 0;
    abStack_39[0xf] = 0;
    abStack_39[0x10] = 0;
    abStack_39[0x11] = 0;
    abStack_39[0x12] = 0;
    if (uVar10 == 0) {
      abStack_39[0x12] = 0x30;
      uVar8 = 0x11;
    }
    else {
      uVar4 = 0x12;
      do {
        uVar8 = uVar4 - 1;
        abStack_39[uVar4] = (byte)uVar10 & 7 | 0x30;
        if (uVar10 < 8) break;
        uVar10 = uVar10 >> 3;
        bVar1 = 1 < uVar4;
        uVar4 = uVar8;
      } while (bVar1);
    }
    if (show_base && 0 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      abStack_39[(uVar8 & 0xffffffff) + 1] = 0x30;
    }
    if (show_pos && 0 < (long)uVar8) {
      uVar8 = uVar8 - 1;
      abStack_39[(uVar8 & 0xffffffff) + 1] = 0x2b;
    }
    if (field_width != 0) {
      lVar5 = 0;
      if (field_width < 0x13) {
        lVar5 = 0x12 - field_width;
      }
      while (lVar5 < (long)uVar8) {
        uVar8 = uVar8 - 1;
        abStack_39[(uVar8 & 0xffffffff) + 1] = fill_char_str;
      }
    }
    abStack_39[0x13] = 0;
    lVar5 = 0;
    do {
      bVar9 = abStack_39[lVar5 + uVar8 + 1];
      str_result[lVar5] = bVar9;
      lVar5 = lVar5 + 1;
    } while (bVar9 != 0);
  }
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }